

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modinv64_impl.h
# Opt level: O3

void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x,secp256k1_modinv64_modinfo *modinfo)

{
  int iVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_trans2x2 t;
  secp256k1_modinv64_signed62 d;
  ulong local_138 [8];
  secp256k1_modinv64_signed62 *local_f8;
  long local_f0;
  ulong local_e8 [8];
  secp256k1_modinv64_trans2x2 local_a8;
  secp256k1_modinv64_signed62 local_88;
  secp256k1_modinv64_signed62 local_58;
  
  local_88.v[2] = 0;
  local_88.v[3] = 0;
  local_88.v[0] = 0;
  local_88.v[1] = 0;
  local_88.v[4] = 0;
  local_58.v[3] = 0;
  local_58.v[4] = 0;
  local_58.v[1] = 0;
  local_58.v[2] = 0;
  local_58.v[0] = 1;
  local_e8[6] = (modinfo->modulus).v[4];
  local_e8[2] = (modinfo->modulus).v[0];
  local_e8[3] = (modinfo->modulus).v[1];
  local_e8[4] = (modinfo->modulus).v[2];
  local_e8[5] = (modinfo->modulus).v[3];
  local_138[6] = x->v[4];
  local_138[2] = x->v[0];
  local_138[3] = x->v[1];
  local_138[4] = x->v[2];
  local_138[5] = x->v[3];
  uVar16 = 5;
  local_138[0] = 0xffffffffffffffff;
  local_f0 = 0x4000000000000000;
  local_f8 = x;
  do {
    uVar20 = local_e8[2];
    uVar10 = local_138[2];
    lVar6 = 0;
    if ((local_138[2] | 0xc000000000000000) != 0) {
      for (; ((local_138[2] | 0xc000000000000000) >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
      }
    }
    local_138[0] = local_138[0] - lVar6;
    if (lVar6 == 0x3e) {
      lVar22 = 1;
      lVar6 = 0;
      lVar8 = 0;
      lVar19 = local_f0;
    }
    else {
      lVar19 = 1L << ((byte)lVar6 & 0x3f);
      lVar22 = 1;
      uVar21 = local_138[2] >> ((byte)lVar6 & 0x3f);
      iVar1 = 0x3e - (int)lVar6;
      lVar8 = 0;
      lVar6 = 0;
      uVar5 = local_e8[2];
      do {
        iVar9 = (int)uVar21;
        bVar3 = (byte)iVar1;
        if ((long)local_138[0] < 0) {
          local_138[0] = -local_138[0];
          uVar13 = -uVar5;
          lVar14 = -lVar19;
          lVar12 = -lVar8;
          iVar4 = (int)local_138[0] + 1;
          bVar2 = (byte)iVar4;
          if (iVar1 <= iVar4) {
            bVar2 = bVar3;
          }
          uVar11 = (uint)(0xffffffffffffffff >> (-bVar2 & 0x3f)) &
                   (iVar9 * iVar9 + 0x3e) * iVar9 * (int)uVar13 & 0x3f;
          uVar5 = uVar21;
          lVar7 = lVar22;
          lVar19 = lVar6;
        }
        else {
          iVar4 = (int)local_138[0] + 1;
          bVar2 = (byte)iVar4;
          if (iVar1 <= iVar4) {
            bVar2 = bVar3;
          }
          uVar11 = (uint)(0xffffffffffffffff >> (-bVar2 & 0x3f)) &
                   -((((int)uVar5 * 2 + 2U & 8) + (int)uVar5) * iVar9) & 0xf;
          lVar7 = lVar8;
          uVar13 = uVar21;
          lVar14 = lVar6;
          lVar12 = lVar22;
        }
        uVar15 = (ulong)uVar11;
        uVar13 = uVar15 * uVar5 + uVar13;
        lVar6 = lVar19 * uVar15 + lVar14;
        uVar21 = -1L << (bVar3 & 0x3f) | uVar13;
        lVar14 = 0;
        if (uVar21 != 0) {
          for (; (uVar21 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        bVar3 = (byte)lVar14;
        uVar21 = uVar13 >> (bVar3 & 0x3f);
        lVar19 = lVar19 << (bVar3 & 0x3f);
        lVar8 = lVar7 << (bVar3 & 0x3f);
        lVar22 = lVar12 + uVar15 * lVar7;
        local_138[0] = local_138[0] - lVar14;
        iVar1 = iVar1 - (int)lVar14;
      } while (iVar1 != 0);
    }
    local_138[1] = uVar16;
    local_a8.u = lVar19;
    local_a8.v = lVar8;
    local_a8.q = lVar6;
    local_a8.r = lVar22;
    secp256k1_modinv64_update_de_62(&local_88,&local_58,&local_a8,modinfo);
    uVar16 = local_138[1];
    lVar14 = SUB168(SEXT816(lVar8) * SEXT816((long)uVar10),8) +
             SUB168(SEXT816(lVar19) * SEXT816((long)uVar20),8) +
             (ulong)CARRY8(lVar8 * uVar10,lVar19 * uVar20);
    lVar12 = SUB168(SEXT816(lVar22) * SEXT816((long)uVar10),8) +
             SUB168(SEXT816(lVar6) * SEXT816((long)uVar20),8) +
             (ulong)CARRY8(lVar22 * uVar10,lVar6 * uVar20);
    uVar5 = lVar22 * uVar10 + lVar6 * uVar20 >> 0x3e | lVar12 * 4;
    uVar10 = lVar8 * uVar10 + lVar19 * uVar20 >> 0x3e | lVar14 * 4;
    iVar1 = (int)local_138[1];
    uVar20 = (ulong)iVar1;
    if (iVar1 < 2) {
      local_e8[uVar20 + 1] = uVar10;
      local_138[uVar20 + 1] = uVar5;
      uVar21 = local_138[2];
joined_r0x0013284f:
      if (uVar21 == 0) goto LAB_001328a1;
    }
    else {
      local_e8[0] = uVar20;
      uVar13 = local_138[1] & 0xffffffff;
      uVar21 = 1;
      local_e8[1] = lVar22;
      do {
        uVar20 = local_e8[uVar21 + 2];
        uVar15 = local_138[uVar21 + 2];
        uVar17 = uVar20 * lVar19 + uVar10;
        uVar18 = uVar17 + uVar15 * lVar8;
        lVar14 = SUB168(SEXT816((long)uVar20) * SEXT816(lVar19),8) + (lVar14 >> 0x3e) +
                 (ulong)CARRY8(uVar20 * lVar19,uVar10) +
                 SUB168(SEXT816((long)uVar15) * SEXT816(lVar8),8) +
                 (ulong)CARRY8(uVar17,uVar15 * lVar8);
        uVar10 = uVar20 * lVar6 + uVar5;
        uVar17 = uVar10 + uVar15 * local_e8[1];
        lVar12 = SUB168(SEXT816((long)uVar20) * SEXT816(lVar6),8) + (lVar12 >> 0x3e) +
                 (ulong)CARRY8(uVar20 * lVar6,uVar5) +
                 SUB168(SEXT816((long)uVar15) * SEXT816((long)local_e8[1]),8) +
                 (ulong)CARRY8(uVar10,uVar15 * local_e8[1]);
        uVar10 = lVar14 * 4 | uVar18 >> 0x3e;
        local_e8[uVar21 + 1] = uVar18 & 0x3fffffffffffffff;
        uVar5 = lVar12 * 4 | uVar17 >> 0x3e;
        local_138[uVar21 + 1] = uVar17 & 0x3fffffffffffffff;
        uVar20 = local_e8[0];
        uVar21 = uVar21 + 1;
      } while (uVar13 != uVar21);
      local_e8[local_e8[0] + 1] = uVar10;
      local_138[local_e8[0] + 1] = uVar5;
      if (local_138[2] == 0) {
        if (1 < iVar1) {
          uVar15 = 1;
          uVar21 = 0;
          do {
            uVar21 = uVar21 | local_138[uVar15 + 2];
            uVar15 = uVar15 + 1;
          } while (uVar13 != uVar15);
          goto joined_r0x0013284f;
        }
LAB_001328a1:
        secp256k1_modinv64_normalize_62(&local_88,uVar10,modinfo);
        local_f8->v[4] = local_88.v[4];
        local_f8->v[2] = local_88.v[2];
        local_f8->v[3] = local_88.v[3];
        local_f8->v[0] = local_88.v[0];
        local_f8->v[1] = local_88.v[1];
        return;
      }
    }
    if (((long)uVar5 >> 0x3f == uVar5 && -1 < (long)(uVar20 - 2)) && (long)uVar10 >> 0x3f == uVar10)
    {
      local_e8[uVar20] = local_e8[uVar20] | uVar10 << 0x3e;
      local_138[uVar20] = local_138[uVar20] | uVar5 << 0x3e;
      uVar16 = (ulong)(iVar1 - 1);
    }
  } while( true );
}

Assistant:

static void secp256k1_modinv64_var(secp256k1_modinv64_signed62 *x, const secp256k1_modinv64_modinfo *modinfo) {
    /* Start with d=0, e=1, f=modulus, g=x, eta=-1. */
    secp256k1_modinv64_signed62 d = {{0, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 e = {{1, 0, 0, 0, 0}};
    secp256k1_modinv64_signed62 f = modinfo->modulus;
    secp256k1_modinv64_signed62 g = *x;
#ifdef VERIFY
    int i = 0;
#endif
    int j, len = 5;
    int64_t eta = -1; /* eta = -delta; delta is initially 1 */
    int64_t cond, fn, gn;

    /* Do iterations of 62 divsteps each until g=0. */
    while (1) {
        /* Compute transition matrix and new eta after 62 divsteps. */
        secp256k1_modinv64_trans2x2 t;
        eta = secp256k1_modinv64_divsteps_62_var(eta, f.v[0], g.v[0], &t);
        /* Update d,e using that transition matrix. */
        secp256k1_modinv64_update_de_62(&d, &e, &t, modinfo);
        /* Update f,g using that transition matrix. */
#ifdef VERIFY
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
        secp256k1_modinv64_update_fg_62_var(len, &f, &g, &t);
        /* If the bottom limb of g is zero, there is a chance that g=0. */
        if (g.v[0] == 0) {
            cond = 0;
            /* Check if the other limbs are also 0. */
            for (j = 1; j < len; ++j) {
                cond |= g.v[j];
            }
            /* If so, we're done. */
            if (cond == 0) break;
        }

        /* Determine if len>1 and limb (len-1) of both f and g is 0 or -1. */
        fn = f.v[len - 1];
        gn = g.v[len - 1];
        cond = ((int64_t)len - 2) >> 63;
        cond |= fn ^ (fn >> 63);
        cond |= gn ^ (gn >> 63);
        /* If so, reduce length, propagating the sign of f and g's top limb into the one below. */
        if (cond == 0) {
            f.v[len - 2] |= (uint64_t)fn << 62;
            g.v[len - 2] |= (uint64_t)gn << 62;
            --len;
        }
#ifdef VERIFY
        VERIFY_CHECK(++i < 12); /* We should never need more than 12*62 = 744 divsteps */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) > 0); /* f > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) <= 0); /* f <= modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, -1) > 0); /* g > -modulus */
        VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &modinfo->modulus, 1) < 0);  /* g <  modulus */
#endif
    }

    /* At this point g is 0 and (if g was not originally 0) f must now equal +/- GCD of
     * the initial f, g values i.e. +/- 1, and d now contains +/- the modular inverse. */
#ifdef VERIFY
    /* g == 0 */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&g, len, &SECP256K1_SIGNED62_ONE, 0) == 0);
    /* |f| == 1, or (x == 0 and d == 0 and |f|=modulus) */
    VERIFY_CHECK(secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, -1) == 0 ||
                 secp256k1_modinv64_mul_cmp_62(&f, len, &SECP256K1_SIGNED62_ONE, 1) == 0 ||
                 (secp256k1_modinv64_mul_cmp_62(x, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  secp256k1_modinv64_mul_cmp_62(&d, 5, &SECP256K1_SIGNED62_ONE, 0) == 0 &&
                  (secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, 1) == 0 ||
                   secp256k1_modinv64_mul_cmp_62(&f, len, &modinfo->modulus, -1) == 0)));
#endif

    /* Optionally negate d, normalize to [0,modulus), and return it. */
    secp256k1_modinv64_normalize_62(&d, f.v[len - 1], modinfo);
    *x = d;
}